

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-cda-dump.cpp
# Opt level: O1

void dump_graph(CDGraph *graph)

{
  CDGraph *pCVar1;
  ulong *puVar2;
  ulong uVar3;
  long *plVar4;
  long lVar5;
  ostream *poVar6;
  CDGraph *pCVar7;
  long *plVar8;
  CDGraph *pCVar9;
  ulong *puVar10;
  long lVar11;
  CDGraph *__range1;
  
  puVar10 = *(ulong **)(graph + 0x20);
  puVar2 = *(ulong **)(graph + 0x28);
  if (puVar10 != puVar2) {
    pCVar1 = graph + 0x40;
    do {
      uVar3 = *puVar10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,*(char **)graph,*(long *)(graph + 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_",1);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," [label=\"",9);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,*(char **)graph,*(long *)(graph + 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
      pCVar7 = pCVar1;
      for (pCVar9 = *(CDGraph **)(graph + 0x48); pCVar9 != (CDGraph *)0x0;
          pCVar9 = *(CDGraph **)(pCVar9 + (ulong)(*(ulong *)(pCVar9 + 0x20) < uVar3) * 8 + 0x10)) {
        if (*(ulong *)(pCVar9 + 0x20) >= uVar3) {
          pCVar7 = pCVar9;
        }
      }
      pCVar9 = pCVar1;
      if ((pCVar7 != pCVar1) && (pCVar9 = pCVar7, uVar3 < *(ulong *)(pCVar7 + 0x20))) {
        pCVar9 = pCVar1;
      }
      if (pCVar9 != pCVar1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," color=blue",0xb);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]\n",2);
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar2);
  }
  plVar4 = *(long **)(graph + 0x28);
  for (plVar8 = *(long **)(graph + 0x20); plVar8 != plVar4; plVar8 = plVar8 + 1) {
    lVar5 = ((long *)*plVar8)[1];
    for (lVar11 = *(long *)*plVar8; lVar11 != lVar5; lVar11 = lVar11 + 8) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,*(char **)graph,*(long *)(graph + 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_",1);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," -> ",4);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,*(char **)graph,*(long *)(graph + 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_",1);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    }
  }
  return;
}

Assistant:

static void dump_graph(CDGraph *graph) {
    assert(graph);
    // dump nodes
    for (const auto *nd : *graph) {
        std::cout << " " << graph->getName() << "_" << nd->getID()
                  << " [label=\"" << graph->getName() << ":" << nd->getID()
                  << "\"";
        if (graph->isPredicate(*nd)) {
            std::cout << " color=blue";
        }
        std::cout << "]\n";
    }

    // dump edges
    for (const auto *nd : *graph) {
        for (const auto *succ : nd->successors()) {
            std::cout << " " << graph->getName() << "_" << nd->getID() << " -> "
                      << graph->getName() << "_" << succ->getID() << "\n";
        }
    }
}